

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printSslCertificate(X509 *cert)

{
  ASN1_INTEGER *ai;
  ASN1_TIME *time;
  ASN1_TIME *time_00;
  X509_NAME *name;
  X509_NAME *name_00;
  C *pCVar1;
  BigNum bigNum;
  Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_> local_58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  ai = X509_get_serialNumber((X509 *)cert);
  time = (ASN1_TIME *)X509_getm_notBefore(cert);
  time_00 = (ASN1_TIME *)X509_getm_notAfter(cert);
  name = X509_get_subject_name((X509 *)cert);
  name_00 = X509_get_issuer_name((X509 *)cert);
  axl::cry::BigNum::BigNum((BigNum *)&local_58);
  axl::cry::BigNum::create((BigNum *)&local_58);
  ASN1_INTEGER_to_BN(ai,(BIGNUM *)local_58.m_h);
  axl::cry::BigNum::getHexString((String *)&local_50,(BigNum *)&local_58);
  pCVar1 = local_50.m_p;
  if (local_50.m_length == 0) {
    pCVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("  serial:     %s\n",pCVar1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
  axl::cry::getAsn1TimeString((String *)&local_50,time);
  pCVar1 = local_50.m_p;
  if (local_50.m_length == 0) {
    pCVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("  valid from: %s\n",pCVar1);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
  axl::cry::getAsn1TimeString((String *)&local_50,time_00);
  if (local_50.m_length == 0) {
    local_50.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("  valid to:   %s\n",local_50.m_p);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
  puts("  subject:");
  printX509Name((X509_name_st *)name);
  puts("  issuer:");
  printX509Name((X509_name_st *)name_00);
  axl::sl::Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>::~Handle
            (&local_58);
  return;
}

Assistant:

void
printSslCertificate(X509* cert) {
//	int result;

	ASN1_INTEGER* serialNumber = X509_get_serialNumber(cert);
	ASN1_TIME* notBeforeTime = X509_get_notBefore(cert);
	ASN1_TIME* notAfterTime = X509_get_notAfter(cert);
	X509_name_st* subjectName = X509_get_subject_name(cert);
	X509_name_st* issuerName = X509_get_issuer_name(cert);

	cry::BigNum bigNum;
	bigNum.create();
	ASN1_INTEGER_to_BN(serialNumber, bigNum);
	printf("  serial:     %s\n", bigNum.getHexString().sz());
	printf("  valid from: %s\n", cry::getAsn1TimeString(notBeforeTime).sz());
	printf("  valid to:   %s\n", cry::getAsn1TimeString(notAfterTime).sz());

	printf("  subject:\n");
	printX509Name(subjectName);

	printf("  issuer:\n");
	printX509Name(issuerName);
}